

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O3

QString * QtPrivate::QStringList_join
                    (QString *__return_storage_ptr__,QStringList *that,QChar *sep,qsizetype seplen)

{
  ArrayOptions *pAVar1;
  long lVar2;
  Data *pDVar3;
  long lVar4;
  long lVar5;
  qsizetype alloc;
  QString *str;
  qsizetype i;
  
  lVar2 = (that->d).size;
  if (lVar2 == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar5 = 0;
    lVar4 = 0;
    do {
      lVar4 = lVar4 + seplen + *(long *)((long)&(((that->d).ptr)->d).size + lVar5);
      lVar5 = lVar5 + 0x18;
    } while (lVar2 * 0x18 != lVar5);
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    lVar4 = lVar4 - seplen;
    if (lVar4 != 0) {
      alloc = 0;
      if (0 < lVar4) {
        alloc = lVar4;
      }
      QString::reallocData(__return_storage_ptr__,alloc,KeepSize);
      pDVar3 = (__return_storage_ptr__->d).d;
      if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
        pAVar1 = &(pDVar3->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      lVar4 = 0;
      lVar5 = 0;
      do {
        if (lVar5 == 0) {
          str = (that->d).ptr;
        }
        else {
          QString::append(__return_storage_ptr__,sep,seplen);
          str = (QString *)((long)&(((that->d).ptr)->d).d + lVar4);
        }
        QString::append(__return_storage_ptr__,str);
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x18;
      } while (lVar2 != lVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QtPrivate::QStringList_join(const QStringList *that, const QChar *sep, qsizetype seplen)
{
    const qsizetype totalLength = accumulatedSize(*that, seplen);
    const qsizetype size = that->size();

    QString res;
    if (totalLength == 0)
        return res;
    res.reserve(totalLength);
    for (qsizetype i = 0; i < size; ++i) {
        if (i)
            res.append(sep, seplen);
        res += that->at(i);
    }
    return res;
}